

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * monty_modsqrt(ModsqrtContext *sc,mp_int *x,uint *success)

{
  ulong uVar1;
  MontyContext *mc;
  uint which;
  uint uVar2;
  mp_int *pmVar3;
  mp_int *src;
  ulong uVar4;
  ulong uVar5;
  mp_int xk;
  mp_int power_of_zk;
  mp_int scratch;
  mp_int tmp;
  mp_int local_78;
  mp_int local_68;
  mp_int local_58;
  mp_int local_40;
  
  if (sc->zk == (mp_int *)0x0) {
    pmVar3 = monty_pow(sc->mc,sc->z,sc->k);
    sc->zk = pmVar3;
  }
  pmVar3 = mp_make_sized(sc->mc->rw * 3);
  local_58.nw = pmVar3->nw;
  local_58.w = pmVar3->w;
  src = monty_pow(sc->mc,x,sc->km1o2);
  local_78 = mp_alloc_from_scratch(&local_58,sc->mc->rw);
  mp_copy_into(&local_78,src);
  monty_mul_into(sc->mc,src,src,x);
  monty_mul_into(sc->mc,&local_78,src,&local_78);
  local_40 = mp_alloc_from_scratch(&local_58,sc->mc->rw);
  local_68 = mp_alloc_from_scratch(&local_58,sc->mc->rw);
  mp_copy_into(&local_68,sc->zk);
  uVar4 = 0;
  while (uVar4 < sc->e) {
    mp_copy_into(&local_40,&local_78);
    uVar1 = uVar4 + 1;
    for (uVar5 = uVar1; mc = sc->mc, uVar5 < sc->e; uVar5 = uVar5 + 1) {
      monty_mul_into(mc,&local_40,&local_40,&local_40);
    }
    which = mp_cmp_eq(&local_40,mc->powers_of_r_mod_m[0]);
    if (uVar4 == 0) {
      uVar2 = mp_eq_integer(x,0);
      *success = uVar2 | which;
      uVar4 = uVar1;
    }
    else {
      monty_mul_into(mc,&local_40,src,&local_68);
      mp_select_into(src,&local_40,src,which);
      monty_mul_into(sc->mc,&local_68,&local_68,&local_68);
      monty_mul_into(sc->mc,&local_40,&local_78,&local_68);
      mp_select_into(&local_78,&local_40,&local_78,which);
      uVar4 = uVar1;
    }
  }
  mp_free(pmVar3);
  return src;
}

Assistant:

mp_int *monty_modsqrt(ModsqrtContext *sc, mp_int *x, unsigned *success)
{
    modsqrt_lazy_setup(sc);

    mp_int *scratch_to_free = mp_make_sized(3 * sc->mc->rw);
    mp_int scratch = *scratch_to_free;

    /*
     * Compute toret = x^{(k+1)/2}, our starting point for the output
     * square root, and also xk = x^k which we'll use as we go along
     * for knowing when to apply correction factors. We do this by
     * first computing x^{(k-1)/2}, then multiplying it by x, then
     * multiplying the two together.
     */
    mp_int *toret = monty_pow(sc->mc, x, sc->km1o2);
    mp_int xk = mp_alloc_from_scratch(&scratch, sc->mc->rw);
    mp_copy_into(&xk, toret);
    monty_mul_into(sc->mc, toret, toret, x);
    monty_mul_into(sc->mc, &xk, toret, &xk);

    mp_int tmp = mp_alloc_from_scratch(&scratch, sc->mc->rw);

    mp_int power_of_zk = mp_alloc_from_scratch(&scratch, sc->mc->rw);
    mp_copy_into(&power_of_zk, sc->zk);

    for (size_t i = 0; i < sc->e; i++) {
        mp_copy_into(&tmp, &xk);
        for (size_t j = i+1; j < sc->e; j++)
            monty_mul_into(sc->mc, &tmp, &tmp, &tmp);
        unsigned eq1 = mp_cmp_eq(&tmp, monty_identity(sc->mc));

        if (i == 0) {
            /* One special case: if x=0, then no power of x will ever
             * equal 1, but we should still report success on the
             * grounds that 0 does have a square root mod p. */
            *success = eq1 | mp_eq_integer(x, 0);
        } else {
            monty_mul_into(sc->mc, &tmp, toret, &power_of_zk);
            mp_select_into(toret, &tmp, toret, eq1);

            monty_mul_into(sc->mc, &power_of_zk,
                           &power_of_zk, &power_of_zk);

            monty_mul_into(sc->mc, &tmp, &xk, &power_of_zk);
            mp_select_into(&xk, &tmp, &xk, eq1);
        }
    }

    mp_free(scratch_to_free);

    return toret;
}